

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_cat.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  uchar *data;
  
  data = (uchar *)operator_new__(10000);
  memset(data,0,10000);
  iVar1 = libbrain::
          state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)7,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)4,_(libbrain::bfop)3,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)0,_(libbrain::bfop)2,_(libbrain::bfop)5,_(libbrain::bfop)3,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)2,_(libbrain::bfop)1,_(libbrain::bfop)3,_(libbrain::bfop)8,_(libbrain::bfop)2,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec(data,0);
  operator_delete__(data);
  return iVar1;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(10000);

    // the cat program: reads from the input until such a time as it reads a 'tab' character
    BRAIN_PROGRAM stdin_cat = BRAIN_COMPILE(+++++++++>,<[->-<]>[+++++++++.<+++++++++>,<[->-<]>]);

    int status_code = stdin_cat.exec(data, 0);

    delete[] data;

    return status_code;
}